

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,_Bool clamp)

{
  ImDrawVert *pIVar1;
  ImVec2 IVar2;
  ImDrawVert *vertex;
  ImDrawVert *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar4 = b->x - a->x;
  fVar5 = b->y - a->y;
  fVar8 = uv_b->x;
  fVar12 = uv_b->y;
  fVar13 = uv_a->x;
  fVar9 = uv_a->y;
  fVar4 = (float)(-(uint)(fVar4 != 0.0) & (uint)((fVar8 - fVar13) / fVar4));
  fVar5 = (float)(-(uint)(fVar5 != 0.0) & (uint)((fVar12 - fVar9) / fVar5));
  pIVar1 = (draw_list->VtxBuffer).Data;
  pIVar3 = pIVar1 + vert_start_idx;
  pIVar1 = pIVar1 + vert_end_idx;
  if (clamp) {
    if (vert_start_idx < vert_end_idx) {
      fVar6 = fVar13;
      if (fVar8 <= fVar13) {
        fVar6 = fVar8;
      }
      fVar7 = fVar9;
      if (fVar12 <= fVar9) {
        fVar7 = fVar12;
      }
      fVar8 = (float)(~-(uint)(fVar8 <= fVar13) & (uint)fVar8 |
                     (uint)fVar13 & -(uint)(fVar8 <= fVar13));
      fVar12 = (float)(~-(uint)(fVar12 <= fVar9) & (uint)fVar12 |
                      (uint)fVar9 & -(uint)(fVar12 <= fVar9));
      do {
        fVar9 = ((pIVar3->pos).x - a->x) * fVar4 + uv_a->x;
        fVar11 = ((pIVar3->pos).y - a->y) * fVar5 + uv_a->y;
        fVar13 = fVar12;
        if (fVar11 <= fVar12) {
          fVar13 = fVar11;
        }
        fVar14 = fVar8;
        if (fVar9 <= fVar8) {
          fVar14 = fVar9;
        }
        IVar10.x = (float)(-(uint)(fVar9 < fVar6) & (uint)fVar6 |
                          ~-(uint)(fVar9 < fVar6) & (uint)fVar14);
        IVar10.y = (float)(-(uint)(fVar11 < fVar7) & (uint)fVar7 |
                          ~-(uint)(fVar11 < fVar7) & (uint)fVar13);
        pIVar3->uv = IVar10;
        pIVar3 = pIVar3 + 1;
      } while (pIVar3 < pIVar1);
    }
  }
  else if (vert_start_idx < vert_end_idx) {
    do {
      IVar2.y = ((pIVar3->pos).y - a->y) * fVar5 + uv_a->y;
      IVar2.x = ((pIVar3->pos).x - a->x) * fVar4 + uv_a->x;
      pIVar3->uv = IVar2;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 < pIVar1);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}